

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

void __thiscall METADemuxer::readClose(METADemuxer *this)

{
  pointer pSVar1;
  StreamInfo *codecInfo;
  pointer pSVar2;
  
  pSVar1 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    (*pSVar2->m_dataReader->_vptr_AbstractReader[7])
              (pSVar2->m_dataReader,(ulong)(uint)pSVar2->m_readerID);
    if (pSVar2->m_streamReader != (AbstractStreamReader *)0x0) {
      (*(pSVar2->m_streamReader->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[1])
                ();
    }
  }
  std::vector<StreamInfo,_std::allocator<StreamInfo>_>::clear(&this->m_codecInfo);
  return;
}

Assistant:

void METADemuxer::readClose()
{
    for (const auto& codecInfo : m_codecInfo)
    {
        codecInfo.m_dataReader->deleteReader(codecInfo.m_readerID);
        delete codecInfo.m_streamReader;
    }
    m_codecInfo.clear();
}